

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O3

ON_LineCurve * __thiscall ON_LineCurve::operator=(ON_LineCurve *this,ON_LineCurve *src)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (this != src) {
    ON_Curve::operator=(&this->super_ON_Curve,&src->super_ON_Curve);
    dVar1 = (src->m_line).from.x;
    dVar2 = (src->m_line).from.y;
    dVar3 = (src->m_line).from.z;
    dVar4 = (src->m_line).to.x;
    dVar5 = (src->m_line).to.z;
    (this->m_line).to.y = (src->m_line).to.y;
    (this->m_line).to.z = dVar5;
    (this->m_line).from.z = dVar3;
    (this->m_line).to.x = dVar4;
    (this->m_line).from.x = dVar1;
    (this->m_line).from.y = dVar2;
    dVar1 = (src->m_t).m_t[1];
    (this->m_t).m_t[0] = (src->m_t).m_t[0];
    (this->m_t).m_t[1] = dVar1;
    this->m_dim = src->m_dim;
  }
  return this;
}

Assistant:

ON_LineCurve& ON_LineCurve::operator=( const ON_LineCurve& src )
{
  if ( this != &src ) 
  {
    ON_Curve::operator=(src); // copies userdata
    m_line = src.m_line;
    m_t = src.m_t;
    m_dim  = src.m_dim;
  }
  return *this;
}